

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O0

void __thiscall
xray_re::xr_ogf_v4::set_ext_geom
          (xr_ogf_v4 *this,xr_vbuf_vec *ext_vbufs,xr_ibuf_vec *ext_ibufs,xr_swibuf_vec *ext_swibufs)

{
  bool bVar1;
  const_reference that;
  const_reference that_00;
  const_reference that_01;
  xr_swibuf_vec *ext_swibufs_local;
  xr_ibuf_vec *ext_ibufs_local;
  xr_vbuf_vec *ext_vbufs_local;
  xr_ogf_v4 *this_local;
  
  bVar1 = xr_ogf::is_chunk_loaded(&this->super_xr_ogf,7);
  if ((bVar1) || (bVar1 = xr_ogf::is_chunk_loaded(&this->super_xr_ogf,0x15), bVar1)) {
    that = std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>::at
                     (ext_vbufs,(ulong)this->m_ext_vb_index);
    xr_vbuf::proxy(&(this->super_xr_ogf).m_vb,that,(ulong)this->m_ext_vb_offset,
                   (ulong)this->m_ext_vb_size);
  }
  bVar1 = xr_ogf::is_chunk_loaded(&this->super_xr_ogf,8);
  if ((bVar1) || (bVar1 = xr_ogf::is_chunk_loaded(&this->super_xr_ogf,0x15), bVar1)) {
    that_00 = std::vector<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>::at
                        (ext_ibufs,(ulong)this->m_ext_ib_index);
    xr_ibuf::proxy(&(this->super_xr_ogf).m_ib,that_00,(ulong)this->m_ext_ib_offset,
                   (ulong)this->m_ext_ib_size);
  }
  bVar1 = xr_ogf::is_chunk_loaded(&this->super_xr_ogf,0x14);
  if (bVar1) {
    that_01 = std::vector<xray_re::xr_swibuf,_std::allocator<xray_re::xr_swibuf>_>::at
                        (ext_swibufs,(ulong)this->m_ext_swib_index);
    xr_swibuf::proxy(&this->m_swib,that_01);
    setup_ib0(this);
  }
  else {
    bVar1 = xr_ogf::is_chunk_loaded(&this->super_xr_ogf,6);
    if (bVar1) {
      setup_ib0(this);
    }
  }
  return;
}

Assistant:

void xr_ogf_v4::set_ext_geom(const xr_vbuf_vec& ext_vbufs,
		const xr_ibuf_vec& ext_ibufs, const xr_swibuf_vec& ext_swibufs)
{
	if (is_chunk_loaded(OGF4_VCONTAINER) || is_chunk_loaded(OGF4_GCONTAINER))
		m_vb.proxy(ext_vbufs.at(m_ext_vb_index), m_ext_vb_offset, m_ext_vb_size);
	if (is_chunk_loaded(OGF4_ICONTAINER) || is_chunk_loaded(OGF4_GCONTAINER))
		m_ib.proxy(ext_ibufs.at(m_ext_ib_index), m_ext_ib_offset, m_ext_ib_size);
	if (is_chunk_loaded(OGF4_SWICONTAINER)) {
		m_swib.proxy(ext_swibufs.at(m_ext_swib_index));
		setup_ib0();
	} else if (is_chunk_loaded(OGF4_SWIDATA)) {
		setup_ib0();
	}
}